

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# c_api.cpp
# Opt level: O2

ncnn_modelbin_t ncnn_modelbin_create_from_datareader(ncnn_datareader_t dr)

{
  ncnn_modelbin_t _mb;
  ModelBinFromDataReader_c_api *this;
  
  _mb = (ncnn_modelbin_t)malloc(0x20);
  this = (ModelBinFromDataReader_c_api *)operator_new(0x18);
  ModelBinFromDataReader_c_api::ModelBinFromDataReader_c_api(this,_mb,(DataReader *)dr->pthis);
  _mb->pthis = this;
  _mb->load_1d = __ncnn_ModelBinFromDataReader_load_1d;
  _mb->load_2d = __ncnn_ModelBinFromDataReader_load_2d;
  _mb->load_3d = __ncnn_ModelBinFromDataReader_load_3d;
  return _mb;
}

Assistant:

ncnn_modelbin_t ncnn_modelbin_create_from_datareader(const ncnn_datareader_t dr)
{
    ncnn_modelbin_t mb = (ncnn_modelbin_t)malloc(sizeof(struct __ncnn_modelbin_t));
    mb->pthis = (void*)(new ModelBinFromDataReader_c_api(mb, *(const DataReader*)dr->pthis));
    mb->load_1d = __ncnn_ModelBinFromDataReader_load_1d;
    mb->load_2d = __ncnn_ModelBinFromDataReader_load_2d;
    mb->load_3d = __ncnn_ModelBinFromDataReader_load_3d;
    return mb;
}